

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall duckdb::ZSTDScanState::ZSTDScanState(ZSTDScanState *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  ulong uVar1;
  UncompressedStringSegmentState *pUVar2;
  BlockManager *pBVar3;
  BufferManager *pBVar4;
  ZSTD_DCtx *pZVar5;
  data_ptr_t pdVar6;
  page_id_t *ppVar7;
  long lVar8;
  uncompressed_size_t *puVar9;
  BufferHandle local_40;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)&PTR__ZSTDScanState_01783470
  ;
  local_40.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (segment->segment_state).
           super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
           .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  pUVar2 = (UncompressedStringSegmentState *)
           optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                     ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_40);
  this->state = pUVar2;
  pBVar3 = ColumnSegment::GetBlockManager(segment);
  this->block_manager = pBVar3;
  pBVar4 = BufferManager::GetBufferManager(segment->db);
  this->buffer_manager = pBVar4;
  this->decompression_context = (ZSTD_DCtx *)0x0;
  this->segment_block_offset = segment->offset;
  this_00 = &this->segment_handle;
  BufferHandle::BufferHandle(this_00);
  (this->current_vector).
  super_unique_ptr<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ZSTDVectorScanState,_std::default_delete<duckdb::ZSTDVectorScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ZSTDVectorScanState_*,_std::default_delete<duckdb::ZSTDVectorScanState>_>
  .super__Head_base<0UL,_duckdb::ZSTDVectorScanState_*,_false>._M_head_impl =
       (ZSTDVectorScanState *)0x0;
  this->scanned_count = 0;
  AllocatedData::AllocatedData(&this->skip_buffer);
  pZVar5 = duckdb_zstd::ZSTD_createDCtx();
  this->decompression_context = pZVar5;
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_40,this->buffer_manager,&segment->block);
  BufferHandle::operator=(this_00,&local_40);
  BufferHandle::~BufferHandle(&local_40);
  pdVar6 = BufferHandle::Ptr(this_00);
  ppVar7 = (page_id_t *)(pdVar6 + segment->offset);
  uVar1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  this->segment_count = uVar1;
  lVar8 = ((uVar1 >> 0xb) + 1) - (ulong)((uVar1 & 0x7ff) == 0);
  this->page_ids = ppVar7;
  this->page_offsets = (page_offset_t *)(ppVar7 + lVar8);
  puVar9 = (uncompressed_size_t *)((lVar8 * 0xc + 7U & 0x7fffffffffffff8) + (long)ppVar7);
  this->uncompressed_sizes = puVar9;
  this->compressed_sizes = puVar9 + lVar8;
  this->scanned_count = 0;
  return;
}

Assistant:

explicit ZSTDScanState(ColumnSegment &segment)
	    : state(segment.GetSegmentState()->Cast<UncompressedStringSegmentState>()),
	      block_manager(segment.GetBlockManager()), buffer_manager(BufferManager::GetBufferManager(segment.db)),
	      segment_block_offset(segment.GetBlockOffset()) {
		decompression_context = duckdb_zstd::ZSTD_createDCtx();
		segment_handle = buffer_manager.Pin(segment.block);

		auto data = segment_handle.Ptr() + segment.GetBlockOffset();
		idx_t offset = 0;

		segment_count = segment.count.load();
		idx_t amount_of_vectors = (segment_count / ZSTD_VECTOR_SIZE) + ((segment_count % ZSTD_VECTOR_SIZE) != 0);

		// Set pointers to the Vector Metadata
		offset = AlignValue<idx_t, sizeof(page_id_t)>(offset);
		page_ids = reinterpret_cast<page_id_t *>(data + offset);
		offset += (sizeof(page_id_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(page_offset_t)>(offset);
		page_offsets = reinterpret_cast<page_offset_t *>(data + offset);
		offset += (sizeof(page_offset_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(uncompressed_size_t)>(offset);
		uncompressed_sizes = reinterpret_cast<uncompressed_size_t *>(data + offset);
		offset += (sizeof(uncompressed_size_t) * amount_of_vectors);

		offset = AlignValue<idx_t, sizeof(compressed_size_t)>(offset);
		compressed_sizes = reinterpret_cast<compressed_size_t *>(data + offset);
		offset += (sizeof(compressed_size_t) * amount_of_vectors);

		scanned_count = 0;
	}